

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigDecimal.cpp
# Opt level: O3

void xercesc_4_0::XMLBigDecimal::parseDecimal(XMLCh *toParse,MemoryManager *manager)

{
  XMLCh *pXVar1;
  short *psVar2;
  ushort uVar3;
  XMLCh *pXVar4;
  NumberFormatException *this;
  XMLCh *pXVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  lVar7 = -2;
  do {
    lVar8 = lVar7;
    uVar3 = *(ushort *)((long)toParse + lVar8 + 2);
    lVar7 = lVar8 + 2;
  } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[uVar3] < '\0');
  if (uVar3 == 0) {
    this = (NumberFormatException *)__cxa_allocate_exception(0x30);
    NumberFormatException::NumberFormatException
              (this,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
               ,0x143,XMLNUM_WSString,manager);
  }
  else {
    lVar10 = 0;
    if (toParse != (XMLCh *)0x0) {
      do {
        psVar2 = (short *)((long)toParse + lVar10);
        lVar10 = lVar10 + 2;
      } while (*psVar2 != 0);
      lVar10 = (lVar10 >> 1) + -1;
    }
    lVar9 = (long)toParse + lVar8 + 4;
    pXVar4 = toParse + lVar10 + 1;
    lVar8 = lVar7 + lVar10 * -2;
    do {
      pXVar5 = pXVar4 + -2;
      pXVar4 = pXVar4 + -1;
      lVar8 = lVar8 + 2;
    } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)*pXVar5] < '\0');
    if (uVar3 == 0x2b) {
      lVar7 = lVar9;
      if (lVar8 != 0) goto LAB_00249619;
      this = (NumberFormatException *)__cxa_allocate_exception(0x30);
      NumberFormatException::NumberFormatException
                (this,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                 ,0x15a,XMLNUM_Inv_chars,manager);
    }
    else {
      lVar7 = (long)toParse + lVar7;
      if ((uVar3 != 0x2d) || (lVar7 = lVar9, lVar8 != 0)) {
LAB_00249619:
        pXVar5 = (XMLCh *)(lVar7 - 2);
        do {
          pXVar1 = pXVar5 + 1;
          pXVar5 = pXVar5 + 1;
        } while (*pXVar1 == L'0');
        if (pXVar5 < pXVar4) {
          bVar6 = false;
          do {
            if (*pXVar5 == L'.') {
              if (bVar6) {
                this = (NumberFormatException *)__cxa_allocate_exception(0x30);
                NumberFormatException::NumberFormatException
                          (this,
                           "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                           ,0x176,XMLNUM_2ManyDecPoint,manager);
                goto LAB_0024968a;
              }
              bVar6 = true;
            }
            else if ((ushort)(*pXVar5 + L'ￆ') < 0xfff6) {
              this = (NumberFormatException *)__cxa_allocate_exception(0x30);
              NumberFormatException::NumberFormatException
                        (this,
                         "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                         ,0x17b,XMLNUM_Inv_chars,manager);
              goto LAB_0024968a;
            }
            pXVar5 = pXVar5 + 1;
          } while (pXVar5 < pXVar4);
        }
        return;
      }
      this = (NumberFormatException *)__cxa_allocate_exception(0x30);
      NumberFormatException::NumberFormatException
                (this,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                 ,0x152,XMLNUM_Inv_chars,manager);
    }
  }
LAB_0024968a:
  __cxa_throw(this,&NumberFormatException::typeinfo,XMLException::~XMLException);
}

Assistant:

void  XMLBigDecimal::parseDecimal(const XMLCh*         const toParse
                               ,        MemoryManager* const manager)
{

    // Strip leading white space, if any. 
    const XMLCh* startPtr = toParse;
    while (XMLChar1_0::isWhitespace(*startPtr))
        startPtr++;

    // If we hit the end, then return failure
    if (!*startPtr)
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_WSString, manager);

    // Strip tailing white space, if any.
    const XMLCh* endPtr = toParse + XMLString::stringLen(toParse);
    while (XMLChar1_0::isWhitespace(*(endPtr - 1)))
        endPtr--;

    // '+' or '-' is allowed only at the first position
    // and is NOT included in the return parsed string

    if (*startPtr == chDash)
    {
        startPtr++;
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }
    else if (*startPtr == chPlus)
    {
        startPtr++;
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }

    // Strip leading zeros
    while (*startPtr == chDigit_0)
        startPtr++;

    // containning zero, only zero, nothing but zero
    // it is a zero, indeed
    if (startPtr >= endPtr)
    {
        return;
    }

    // Scan data
    bool   dotSignFound = false;
    while (startPtr < endPtr)
    {
        if (*startPtr == chPeriod)
        {
            if (!dotSignFound)
            {
                dotSignFound = true;
                startPtr++;
                continue;
            }
            else  // '.' is allowed only once
                ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_2ManyDecPoint, manager);
        }

        // If not valid decimal digit, then an error
        if ((*startPtr < chDigit_0) || (*startPtr > chDigit_9))
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);

        startPtr++;

    }

    return;
}